

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<float,_std::allocator<float>_> *vec)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RDI;
  float *item;
  const_iterator __end0;
  const_iterator __begin0;
  vector<float,_std::allocator<float>_> *__range2;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_20 [3];
  ostream *local_8;
  
  local_8 = in_RDI;
  local_20[0]._M_current =
       (float *)vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffffc8);
  vector<float,_std::allocator<float>_>::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
         __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
         operator*(local_20);
    poVar2 = (ostream *)
             std::ostream::operator<<(local_8,*(float *)&in_stack_ffffffffffffffd0->_M_current);
    std::operator<<(poVar2,", ");
    __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>::
    operator++(local_20);
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}